

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O2

void __thiscall
xray_re::xr_ogf_v3::set_ext_geom(xr_ogf_v3 *this,xr_vbuf_vec *ext_vbufs,xr_ibuf_vec *ext_ibufs)

{
  uint uVar1;
  const_reference that;
  const_reference that_00;
  
  uVar1 = (this->super_xr_ogf).m_loaded;
  if ((uVar1 >> 10 & 1) != 0) {
    that = std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::at
                     (ext_vbufs,(ulong)this->m_ext_vb_index);
    xr_vbuf::proxy(&(this->super_xr_ogf).m_vb,that,(ulong)this->m_ext_vb_offset,
                   (ulong)this->m_ext_vb_size);
    uVar1 = (this->super_xr_ogf).m_loaded;
  }
  if ((uVar1 >> 0x13 & 1) == 0) {
    return;
  }
  that_00 = std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>::at
                      (ext_ibufs,(ulong)this->m_ext_ib_index);
  xr_ibuf::proxy(&(this->super_xr_ogf).m_ib,that_00,(ulong)this->m_ext_ib_offset,
                 (ulong)this->m_ext_ib_size);
  return;
}

Assistant:

void xr_ogf_v3::set_ext_geom(const xr_vbuf_vec& ext_vbufs, const xr_ibuf_vec& ext_ibufs)
{
	if (is_chunk_loaded(OGF3_VCONTAINER))
		m_vb.proxy(ext_vbufs.at(m_ext_vb_index), m_ext_vb_offset, m_ext_vb_size);
	if (is_chunk_loaded(OGF3_ICONTAINER))
		m_ib.proxy(ext_ibufs.at(m_ext_ib_index), m_ext_ib_offset, m_ext_ib_size);
}